

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

NamedVar * __thiscall
despot::Parser::CreateRewardVar
          (NamedVar *__return_storage_ptr__,Parser *this,TiXmlElement *e_RewardVar)

{
  char *__s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rewardEnum;
  allocator<char> local_69;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  __s = util::tinyxml::TiXmlElement::Attribute(e_RewardVar,"vname");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,__s,(allocator<char> *)&local_50);
  NamedVar::NamedVar(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rew",&local_69);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
             &local_50);
  std::__cxx11::string::~string((string *)&local_50);
  Variable::values(&__return_storage_ptr__->super_Variable,&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return __return_storage_ptr__;
}

Assistant:

RewardVar Parser::CreateRewardVar(TiXmlElement* e_RewardVar) {
	RewardVar rew(e_RewardVar->Attribute("vname"));

	vector<string> rewardEnum;
	rewardEnum.push_back(REWARD_VAR_VALUE);
	rew.values(rewardEnum);

	return rew;
}